

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int EXRLayers(char *filename,char ***layer_names,int *num_layers,char **err)

{
  size_type sVar1;
  void *pvVar2;
  size_type sVar3;
  char *pcVar4;
  undefined4 *in_RDX;
  long *in_RSI;
  size_t c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_vec;
  int ret;
  int ret_1;
  EXRHeader exr_header;
  EXRVersion exr_version;
  EXRHeader *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffda0;
  allocator *paVar5;
  EXRVersion *in_stack_fffffffffffffda8;
  size_type local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  int local_230;
  allocator local_229;
  string local_228 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe08;
  EXRHeader *in_stack_fffffffffffffe10;
  char **in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  EXRVersion *in_stack_ffffffffffffff00;
  EXRHeader *in_stack_ffffffffffffff08;
  int local_30;
  int local_2c;
  int local_4;
  
  InitEXRHeader((EXRHeader *)0x4434c4);
  local_4 = ParseEXRVersionFromFile(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  if (local_4 == 0) {
    if ((local_2c == 0) && (local_30 == 0)) {
      local_230 = ParseEXRHeaderFromFile
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      if (local_230 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x4436a6);
        tinyexr::GetLayers(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_248);
        *in_RDX = (int)sVar1;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_248);
        pvVar2 = malloc(sVar1 << 3);
        *in_RSI = (long)pvVar2;
        local_250 = 0;
        while( true ) {
          sVar1 = local_250;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_248);
          if (sVar3 <= sVar1) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_248,local_250);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          pcVar4 = strdup(pcVar4);
          *(char **)(*in_RSI + local_250 * 8) = pcVar4;
          local_250 = local_250 + 1;
        }
        FreeEXRHeader(in_stack_fffffffffffffd88);
        local_4 = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffda0);
      }
      else {
        FreeEXRHeader(in_stack_fffffffffffffd88);
        local_4 = local_230;
      }
    }
    else {
      paVar5 = &local_229;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_228,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
                 paVar5);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      local_4 = -4;
    }
  }
  else {
    paVar5 = (allocator *)&stack0xfffffffffffffe0f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe10,"Invalid EXR header.",paVar5);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe0f);
  }
  return local_4;
}

Assistant:

int EXRLayers(const char *filename, const char **layer_names[], int *num_layers,
              const char **err) {
  EXRVersion exr_version;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage("Invalid EXR header.", err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
  if (ret != TINYEXR_SUCCESS) {
    FreeEXRHeader(&exr_header);
    return ret;
  }

  std::vector<std::string> layer_vec;
  tinyexr::GetLayers(exr_header, layer_vec);

  (*num_layers) = int(layer_vec.size());
  (*layer_names) = static_cast<const char **>(
      malloc(sizeof(const char *) * static_cast<size_t>(layer_vec.size())));
  for (size_t c = 0; c < static_cast<size_t>(layer_vec.size()); c++) {
#ifdef _MSC_VER
    (*layer_names)[c] = _strdup(layer_vec[c].c_str());
#else
    (*layer_names)[c] = strdup(layer_vec[c].c_str());
#endif
  }

  FreeEXRHeader(&exr_header);
  return TINYEXR_SUCCESS;
}